

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

bool wasm::anon_unknown_0::isFullForced(void)

{
  int iVar1;
  
  if (wasm::(anonymous_namespace)::isFullForced()::full == '\0') {
    iVar1 = __cxa_guard_acquire(&wasm::(anonymous_namespace)::isFullForced()::full);
    if (iVar1 != 0) {
      isFullForced::full = checkIsFullForced();
      __cxa_guard_release(&wasm::(anonymous_namespace)::isFullForced()::full);
    }
  }
  return isFullForced::full;
}

Assistant:

bool isFullForced() {
  static bool full = checkIsFullForced();
  return full;
}